

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O2

shared_ptr<jessilib::parser> __thiscall
jessilib::impl::parser_manager::find_parser(parser_manager *this,string *in_format)

{
  iterator iVar1;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<jessilib::parser> sVar2;
  shared_lock<std::shared_mutex> guard;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = (mutex_type *)in_format;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)in_format);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&in_format[3].field_2,in_RDX);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->m_mutex)._M_impl._M_rwlock.__align = 0;
    *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = 0;
  }
  else {
    std::__shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
                      ._M_cur + 0x28));
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  sVar2.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<jessilib::parser>)
         sVar2.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<parser> parser_manager::find_parser(const std::string& in_format) {
	std::shared_lock<std::shared_mutex> guard{ m_mutex };

	// Search for the parser by key
	auto itr = m_parsers.find(in_format);
	if (itr != m_parsers.end()) {
		// Found our parser; return
		return itr->second;
	}

	// No parser exists for the given format
	return nullptr;
}